

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_initCStream_internal
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_CDict *cdict,
                 ZSTD_CCtx_params *params,unsigned_long_long pledgedSrcSize)

{
  ZSTD_compressionParameters cParams;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  size_t code;
  undefined8 in_stack_ffffffffffffff74;
  size_t err_code_3;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  unsigned_long_long pledgedSrcSize_local;
  ZSTD_CCtx_params *params_local;
  ZSTD_CDict *cdict_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CStream *zcs_local;
  
  zcs_local = (ZSTD_CStream *)ZSTD_CCtx_reset(zcs,ZSTD_reset_session_only);
  uVar6 = ERR_isError((size_t)zcs_local);
  if (uVar6 == 0) {
    zcs_local = (ZSTD_CStream *)ZSTD_CCtx_setPledgedSrcSize(zcs,pledgedSrcSize);
    uVar6 = ERR_isError((size_t)zcs_local);
    if (uVar6 == 0) {
      uVar1 = (params->cParams).hashLog;
      uVar2 = (params->cParams).searchLog;
      uVar3 = (params->cParams).minMatch;
      uVar4 = (params->cParams).targetLength;
      uVar5 = (params->cParams).strategy;
      cParams.minMatch = uVar5;
      cParams.searchLog = uVar4;
      cParams.hashLog = uVar3;
      cParams.chainLog = uVar2;
      cParams.windowLog = uVar1;
      cParams.targetLength = (int)in_stack_ffffffffffffff74;
      cParams.strategy = (int)((ulong)in_stack_ffffffffffffff74 >> 0x20);
      code = ZSTD_checkCParams(cParams);
      uVar6 = ERR_isError(code);
      if (uVar6 != 0) {
        __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x167a,
                      "size_t ZSTD_initCStream_internal(ZSTD_CStream *, const void *, size_t, const ZSTD_CDict *, const ZSTD_CCtx_params *, unsigned long long)"
                     );
      }
      memcpy(&zcs->requestedParams,params,0xd0);
      if ((dict != (void *)0x0) && (cdict != (ZSTD_CDict *)0x0)) {
        __assert_fail("!((dict) && (cdict))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x167c,
                      "size_t ZSTD_initCStream_internal(ZSTD_CStream *, const void *, size_t, const ZSTD_CDict *, const ZSTD_CCtx_params *, unsigned long long)"
                     );
      }
      if (dict == (void *)0x0) {
        zcs_local = (ZSTD_CStream *)ZSTD_CCtx_refCDict(zcs,cdict);
        uVar6 = ERR_isError((size_t)zcs_local);
      }
      else {
        zcs_local = (ZSTD_CStream *)ZSTD_CCtx_loadDictionary(zcs,dict,dictSize);
        uVar6 = ERR_isError((size_t)zcs_local);
      }
      if (uVar6 == 0) {
        zcs_local = (ZSTD_CStream *)0x0;
      }
    }
  }
  return (size_t)zcs_local;
}

Assistant:

size_t ZSTD_initCStream_internal(ZSTD_CStream* zcs,
                    const void* dict, size_t dictSize, const ZSTD_CDict* cdict,
                    const ZSTD_CCtx_params* params,
                    unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_internal");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    zcs->requestedParams = *params;
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if (dict) {
        FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) , "");
    } else {
        /* Dictionary is cleared if !cdict */
        FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, cdict) , "");
    }
    return 0;
}